

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_summon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *pRVar2;
  char *txt;
  allocator<char> local_6a;
  allocator<char> local_69;
  CHAR_DATA *victim;
  CHAR_DATA *ch_local;
  string local_58;
  string local_38;
  
  ch_local = ch;
  ch_00 = get_char_world(ch,target_name);
  victim = ch_00;
  if ((ch_00 != ch && ch_00 != (CHAR_DATA *)0x0) && (ch_00->in_room != (ROOM_INDEX_DATA *)0x0)) {
    bVar1 = is_npc(ch_00);
    if (bVar1) {
      pRVar2 = ch->in_room;
    }
    else {
      pRVar2 = ch->in_room;
      if (ch_00->in_room->area != pRVar2->area) goto LAB_0030a32b;
    }
    if ((((pRVar2->room_flags[0] & 0x400400) == 0) && (pRVar2->guild == 0)) &&
       (ch_00->in_room->guild == 0)) {
      bVar1 = is_npc(ch_00);
      if (bVar1) {
        bVar1 = is_affected_by(ch_00,0x12);
        pRVar2 = ch_00->in_room;
        if ((bVar1) && (pRVar2->area != ch->in_room->area)) goto LAB_0030a32b;
      }
      else {
        pRVar2 = ch_00->in_room;
      }
      if (((((pRVar2->room_flags[0] & 0x800e00) == 0) &&
           ((bVar1 = is_npc(ch_00), !bVar1 || ((ch_00->act[0] & 0x20) == 0)))) &&
          ((bVar1 = is_npc(ch_00), !bVar1 || ((int)ch_00->level < level + 10)))) &&
         ((((((bVar1 = is_npc(ch_00), bVar1 || (ch_00->level < 0x34)) ||
             (bVar1 = is_immortal(ch), bVar1)) &&
            ((ch_00->fighting == (CHAR_DATA *)0x0 &&
             ((bVar1 = is_npc(ch_00), !bVar1 || ((ch_00->imm_flags[0] & 1) == 0)))))) &&
           ((bVar1 = is_npc(ch_00), !bVar1 || (ch_00->pIndexData->pShop == (SHOP_DATA *)0x0)))) &&
          (((((bVar1 = is_npc(ch_00), !bVar1 || ((ch_00->act[0] & 0x20) == 0)) &&
             ((bVar1 = is_npc(ch_00), bVar1 ||
              ((bVar1 = can_pk(ch,ch_00), bVar1 || ((ch_00->act[0] & 0x10000) == 0)))))) &&
            (bVar1 = can_see(ch,ch_00), bVar1)) &&
           (((bVar1 = is_explore(ch->in_room), !bVar1 &&
             (bVar1 = is_explore(ch_00->in_room), !bVar1)) &&
            (bVar1 = is_affected(ch_00,(int)gsn_bind_feet), !bVar1)))))))) {
        bVar1 = is_affected_by(ch,0xe);
        if (!bVar1) {
          bVar1 = saves_spell(level + 1,ch_00,0x10);
          if (bVar1) {
            act("$N resisted your summoning.",ch,(void *)0x0,ch_00,3);
            bVar1 = saves_spell(level + -1,ch_00,0x10);
            if (bVar1) {
              txt = "You feel a strange wrenching sensation, but it passes.\n\r";
              ch = ch_00;
              goto LAB_0030a335;
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"spell_summon",&local_69);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"summon_char",&local_6a);
            CQueue::AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
                      (&RS.Queue,3,&local_38,&local_58,summon_char,&ch_local,&victim);
            std::__cxx11::string::~string((string *)&local_58);
            std::__cxx11::string::~string((string *)&local_38);
            act("You begin the summoning of $N.",ch_local,(void *)0x0,victim,3);
            bVar1 = saves_spell(level,victim,0x10);
            if (bVar1) {
              send_to_char("You feel a strange wrenching sensation at the very core of your being.\n\r"
                           ,victim);
            }
          }
          return;
        }
        txt = "You lack the concentration to summon while in a rage.\n\r";
        goto LAB_0030a335;
      }
    }
  }
LAB_0030a32b:
  txt = "You failed.\n\r";
LAB_0030a335:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_summon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;

	victim = get_char_world(ch, target_name);

	if (victim == nullptr
		|| victim == ch
		|| victim->in_room == nullptr
		|| (!is_npc(victim) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_SUMMON_TO)
		|| ch->in_room->guild != 0
		|| victim->in_room->guild != 0
		|| (is_npc(victim) && is_affected_by(victim, AFF_CHARM) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(victim->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(victim->in_room->room_flags, ROOM_PRIVATE)
		|| IS_SET(victim->in_room->room_flags, ROOM_SOLITARY)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_SUMMON_FROM)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (is_npc(victim) && victim->level >= (level + 10))
		|| (!is_npc(victim) && victim->level >= LEVEL_IMMORTAL && !is_immortal(ch))
		|| victim->fighting != nullptr
		|| (is_npc(victim) && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (is_npc(victim) && victim->pIndexData->pShop != nullptr)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (!is_npc(victim) && !can_pk(ch, victim) && IS_SET(victim->act, PLR_NOSUMMON))
		|| !can_see(ch, victim)
		|| is_explore(ch->in_room)
		|| is_explore(victim->in_room)
		|| is_affected(victim, gsn_bind_feet))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_RAGE))
	{
		send_to_char("You lack the concentration to summon while in a rage.\n\r", ch);
		return;
	}

	if (saves_spell(level + 1, victim, DAM_OTHER))
	{
		act("$N resisted your summoning.", ch, 0, victim, TO_CHAR);

		if (saves_spell(level - 1, victim, DAM_OTHER))
			send_to_char("You feel a strange wrenching sensation, but it passes.\n\r", victim);

		return;
	}

	RS.Queue.AddToQueue(3, "spell_summon", "summon_char", summon_char, ch, victim);

	act("You begin the summoning of $N.", ch, 0, victim, TO_CHAR);

	if (saves_spell(level, victim, DAM_OTHER))
		send_to_char("You feel a strange wrenching sensation at the very core of your being.\n\r", victim);
}